

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

int __thiscall Js::JavascriptBigInt::CompareAbsolute(JavascriptBigInt *this,JavascriptBigInt *pbi)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = this->m_length;
  if (pbi->m_length < uVar4) {
    iVar3 = 1;
  }
  else {
    if (uVar4 < pbi->m_length) {
      return -1;
    }
    iVar3 = 0;
    if (uVar4 != 0) {
      do {
        uVar1 = (this->m_digits).ptr[uVar4 - 1];
        uVar2 = (pbi->m_digits).ptr[uVar4 - 1];
        if (uVar1 != uVar2) {
          return (uVar2 < uVar1) - 1 | 1;
        }
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      return 0;
    }
  }
  return iVar3;
}

Assistant:

int JavascriptBigInt::CompareAbsolute(JavascriptBigInt *pbi)
    {
        digit_t index;

        if (m_length > pbi->m_length)
        {
            return 1;
        }
        if (m_length < pbi->m_length)
        {
            return -1;
        }
        if (0 == m_length)
        {
            return 0;
        }

#pragma prefast(suppress:__WARNING_LOOP_ONLY_EXECUTED_ONCE,"noise")
        for (index = m_length - 1; m_digits[index] == pbi->m_digits[index]; index--)
        {
            if (0 == index)
            {
                return 0;
            }
        }
        Assert(m_digits[index] != pbi->m_digits[index]);

        return (m_digits[index] > pbi->m_digits[index]) ? 1 : -1;
    }